

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::reset_midi(Renderer *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->default_program;
  lVar2 = 0x4c;
  do {
    *(undefined2 *)((long)this->channel + lVar2 + -0x34) = 0x7f64;
    *(undefined8 *)((long)this->channel + lVar2 + -0x44) = 0x200000000000;
    *(undefined4 *)((long)&((Renderer *)(this->channel + -1))->rate + lVar2) = 0;
    *(undefined8 *)((long)this->channel + lVar2 + -0x3c) = 0xc800000000;
    *(undefined4 *)((long)this->channel + lVar2 + -0x30) = 0x3fff3fff;
    *(int *)((long)this->channel + lVar2 + -0x48) = iVar1;
    *(undefined1 *)((long)this->channel + lVar2 + -0x32) = 0xff;
    *(undefined4 *)((long)this->channel + lVar2 + -0x4c) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x2cc);
  memset(this->voice,0,(long)this->voices * 0x170);
  return;
}

Assistant:

void Renderer::reset_midi()
{
	for (int i = 0; i < MAXCHAN; i++)
	{
		reset_controllers(i);
		/* The rest of these are unaffected by the Reset All Controllers event */
		channel[i].program = default_program;
		channel[i].panning = NO_PANNING;
		channel[i].pitchsens = 200;
		channel[i].bank = 0; /* tone bank or drum set */
	}
	reset_voices();
}